

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConnectorFederateManager.cpp
# Opt level: O1

Translator * __thiscall
helics::ConnectorFederateManager::registerTranslator
          (ConnectorFederateManager *this,string_view name,string_view endpointType,
          string_view units)

{
  Translator **ppTVar1;
  pointer this_00;
  int iVar2;
  undefined4 extraout_var;
  RegistrationFailure *this_01;
  char *pcVar3;
  long lVar4;
  Translator *pTVar5;
  size_t sVar6;
  string_view searchValue;
  string_view message;
  InterfaceHandle handle;
  handle trans;
  InterfaceHandle local_3c;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  handle local_28;
  
  local_38._M_str = name._M_str;
  local_38._M_len = name._M_len;
  local_3c.hid = (*this->coreObject->_vptr_Core[0x3c])();
  if (local_3c.hid == 0x9aac0f00) {
    this_01 = (RegistrationFailure *)__cxa_allocate_exception(0x28);
    message._M_str = "Unable to register translator";
    message._M_len = 0x1d;
    RegistrationFailure::RegistrationFailure(this_01,message);
    __cxa_throw(this_01,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
  }
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
  ::lock(&local_28,&this->translators);
  this_00 = local_28.data;
  pcVar3 = local_38._M_str;
  sVar6 = local_38._M_len;
  if (local_38._M_len == 0) {
    iVar2 = (*this->coreObject->_vptr_Core[0x28])(this->coreObject,(ulong)(uint)local_3c.hid);
    pcVar3 = *(char **)CONCAT44(extraout_var,iVar2);
    sVar6 = ((undefined8 *)CONCAT44(extraout_var,iVar2))[1];
  }
  searchValue._M_str = pcVar3;
  searchValue._M_len = sVar6;
  gmlc::containers::StringMappedVector<helics::Translator,(reference_stability)0,5>::
  insert<helics::Federate*&,std::basic_string_view<char,std::char_traits<char>>&,helics::InterfaceHandle&>
            ((StringMappedVector<helics::Translator,(reference_stability)0,5> *)this_00,searchValue,
             &this->fed,&local_38,&local_3c);
  lVar4 = (long)((local_28.data)->dataStorage).bsize;
  ppTVar1 = ((local_28.data)->dataStorage).dataptr;
  if (lVar4 == 0) {
    pTVar5 = ppTVar1[(((local_28.data)->dataStorage).csize >> 5) - 1] + 0x1f;
  }
  else {
    pTVar5 = ppTVar1[((local_28.data)->dataStorage).dataSlotIndex] + lVar4 + -1;
  }
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_28.m_handle_lock);
  return pTVar5;
}

Assistant:

Translator& ConnectorFederateManager::registerTranslator(std::string_view name,
                                                         std::string_view endpointType,
                                                         std::string_view units)
{
    auto handle = coreObject->registerTranslator(name, endpointType, units);
    if (handle.isValid()) {
        auto trans = translators.lock();
        if (name.empty()) {
            trans->insert(coreObject->getHandleName(handle), fed, name, handle);
        } else {
            trans->insert(name, fed, name, handle);
        }
        return trans->back();
    }
    throw(RegistrationFailure("Unable to register translator"));
}